

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

string * __thiscall
BasePort::ProtocolString_abi_cxx11_
          (string *__return_storage_ptr__,BasePort *this,ProtocolType protocol)

{
  allocator<char> *__a;
  int iVar1;
  char *__s;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  iVar1 = (int)this;
  if (iVar1 == 2) {
    __s = "broadcast-query-read-write";
    __a = &local_b;
  }
  else if (iVar1 == 1) {
    __s = "sequential-read-broadcast-write";
    __a = &local_a;
  }
  else if (iVar1 == 0) {
    __s = "sequential-read-write";
    __a = &local_9;
  }
  else {
    __s = "Unknown";
    __a = &local_c;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string BasePort::ProtocolString(ProtocolType protocol)
{
    if (protocol == PROTOCOL_SEQ_RW) {
        return std::string("sequential-read-write");
    } else if (protocol == PROTOCOL_SEQ_R_BC_W) {
        return std::string("sequential-read-broadcast-write");
    } else if (protocol == PROTOCOL_BC_QRW) {
        return std::string("broadcast-query-read-write");
    }
    return std::string("Unknown");
}